

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cc
# Opt level: O0

void __thiscall tt::net::TimerManager::handleExpiredEvent(TimerManager *this)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *peVar3;
  int local_30;
  undefined1 local_20 [8];
  SPTimerNode ptimer_now;
  TimerManager *this_local;
  
  ptimer_now.super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  do {
    bVar1 = std::
            priority_queue<std::shared_ptr<tt::net::TimerNode>,_std::deque<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>,_tt::net::TimerCmp>
            ::empty(&this->timerNodeQueue);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar2 = std::
             priority_queue<std::shared_ptr<tt::net::TimerNode>,_std::deque<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>,_tt::net::TimerCmp>
             ::top(&this->timerNodeQueue);
    std::shared_ptr<tt::net::TimerNode>::shared_ptr
              ((shared_ptr<tt::net::TimerNode> *)local_20,pvVar2);
    peVar3 = std::__shared_ptr_access<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
    bVar1 = TimerNode::isDeleted(peVar3);
    if (bVar1) {
      std::
      priority_queue<std::shared_ptr<tt::net::TimerNode>,_std::deque<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>,_tt::net::TimerCmp>
      ::pop(&this->timerNodeQueue);
LAB_0011aa6f:
      local_30 = 0;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      bVar1 = TimerNode::isValid(peVar3);
      if (!bVar1) {
        std::
        priority_queue<std::shared_ptr<tt::net::TimerNode>,_std::deque<std::shared_ptr<tt::net::TimerNode>,_std::allocator<std::shared_ptr<tt::net::TimerNode>_>_>,_tt::net::TimerCmp>
        ::pop(&this->timerNodeQueue);
        goto LAB_0011aa6f;
      }
      local_30 = 3;
    }
    std::shared_ptr<tt::net::TimerNode>::~shared_ptr((shared_ptr<tt::net::TimerNode> *)local_20);
    if (local_30 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void TimerManager::handleExpiredEvent() {
  // MutexLockGuard locker(lock);
  while (!timerNodeQueue.empty()) {
    SPTimerNode ptimer_now = timerNodeQueue.top();
    if (ptimer_now->isDeleted())
      timerNodeQueue.pop();
    else if (ptimer_now->isValid() == false)
      timerNodeQueue.pop();
    else
      break;
  }
}